

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::Equals<char[6],char[6]>
          (Assert *this,string *msg,char (*expected) [6],char (*actual) [6])

{
  uint *puVar1;
  ostream *poVar2;
  ostringstream s;
  char (*local_1c0) [6];
  string local_1b8;
  long local_198 [3];
  uint auStack_180 [88];
  
  if (expected == actual) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (msg->_M_string_length != 0) {
    local_1b8._M_dataplus._M_p = (pointer)msg;
    poVar2 = details::operator<<((ostream *)local_198,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1b8);
    std::operator<<(poVar2," ");
  }
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::operator<<((ostream *)local_198,"\n");
  poVar2 = std::operator<<((ostream *)local_198,"    Expected <");
  local_1c0 = expected;
  local_1b8._M_dataplus._M_p = (pointer)&local_1c0;
  local_1b8._M_string_length = (size_type)expected;
  poVar2 = details::streamit<char*,char[6]>(poVar2);
  std::operator<<(poVar2,">\n");
  poVar2 = std::operator<<((ostream *)local_198,"     but got <");
  local_1c0 = actual;
  local_1b8._M_dataplus._M_p = (pointer)&local_1c0;
  local_1b8._M_string_length = (size_type)actual;
  poVar2 = details::streamit<char*,char[6]>(poVar2);
  std::operator<<(poVar2,">\n");
  std::operator<<((ostream *)local_198,"  ");
  std::__cxx11::stringbuf::str();
  Error(this,&local_1b8);
}

Assistant:

bool are_equal(const T& lhs, const T& rhs)
    {
        return lhs == rhs;
    }